

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int execSql(sqlite3 *db,char **pzErrMsg,char *zSql)

{
  sqlite3_stmt *pStmt_00;
  int iVar1;
  int iVar2;
  uchar *__s1;
  char *zNew;
  long in_FS_OFFSET;
  bool bVar3;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
  iVar1 = sqlite3LockAndPrepare(db,zSql,-1,0x80,(Vdbe *)0x0,&local_40,(char **)0x0);
  pStmt_00 = local_40;
  if (iVar1 == 0) {
    do {
      iVar2 = sqlite3_step(pStmt_00);
      if (iVar2 != 100) break;
      __s1 = sqlite3_column_text(pStmt_00,0);
      bVar3 = true;
      iVar2 = 100;
      if ((__s1 != (uchar *)0x0) &&
         ((iVar1 = strncmp((char *)__s1,"CRE",3), iVar1 == 0 ||
          (iVar1 = strncmp((char *)__s1,"INS",3), iVar1 == 0)))) {
        iVar2 = execSql(db,pzErrMsg,(char *)__s1);
        bVar3 = iVar2 == 0;
      }
    } while (bVar3);
    iVar1 = 0;
    if (iVar2 != 0x65) {
      iVar1 = iVar2;
    }
    if (iVar1 != 0) {
      zNew = sqlite3_errmsg(db);
      sqlite3SetString(pzErrMsg,db,zNew);
    }
    sqlite3_finalize(local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

static int execSql(sqlite3 *db, char **pzErrMsg, const char *zSql){
  sqlite3_stmt *pStmt;
  int rc;

  /* printf("SQL: [%s]\n", zSql); fflush(stdout); */
  rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
  if( rc!=SQLITE_OK ) return rc;
  while( SQLITE_ROW==(rc = sqlite3_step(pStmt)) ){
    const char *zSubSql = (const char*)sqlite3_column_text(pStmt,0);
    assert( sqlite3_strnicmp(zSql,"SELECT",6)==0 );
    /* The secondary SQL must be one of CREATE TABLE, CREATE INDEX,
    ** or INSERT.  Historically there have been attacks that first
    ** corrupt the sqlite_schema.sql field with other kinds of statements
    ** then run VACUUM to get those statements to execute at inappropriate
    ** times. */
    if( zSubSql
     && (strncmp(zSubSql,"CRE",3)==0 || strncmp(zSubSql,"INS",3)==0)
    ){
      rc = execSql(db, pzErrMsg, zSubSql);
      if( rc!=SQLITE_OK ) break;
    }
  }
  assert( rc!=SQLITE_ROW );
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  if( rc ){
    sqlite3SetString(pzErrMsg, db, sqlite3_errmsg(db));
  }
  (void)sqlite3_finalize(pStmt);
  return rc;
}